

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Main.c
# Opt level: O0

void searchlight_plot(tgestate_t *state,attribute_t *attrs,int clip_left)

{
  byte bVar1;
  undefined1 *puVar2;
  long lVar3;
  int in_EDX;
  long lVar4;
  undefined1 *in_RSI;
  int *in_RDI;
  int carry_out_1;
  int carry_out;
  uint8_t pixels;
  uint8_t iters3;
  int carry;
  uint8_t iters2;
  attribute_t *min_y_attrs;
  attribute_t *saved_attrs;
  attribute_t *max_y_attrs;
  ptrdiff_t x;
  uint8_t iters;
  uint8_t *shape;
  attribute_t *attrs_base;
  byte local_5a;
  char local_59;
  int local_58;
  byte local_51;
  undefined1 *local_50;
  undefined1 *local_40;
  char local_29;
  byte *local_28;
  undefined1 *local_10;
  
  lVar3 = *(long *)(in_RDI + 6) + 0x1830;
  local_58 = 0;
  local_28 = "";
  local_29 = '\x10';
  local_10 = in_RSI;
  do {
    puVar2 = local_10;
    lVar4 = ((long)local_10 - lVar3) % (long)*in_RDI;
    local_40 = (undefined1 *)(lVar3 + *in_RDI * 0x12);
    if ((in_EDX != 0) && (0x15 < lVar4)) {
      local_40 = (undefined1 *)(lVar3 + *in_RDI * 0x13);
    }
    if (local_40 <= local_10) break;
    local_50 = (undefined1 *)(lVar3 + (*in_RDI << 1));
    if ((in_EDX != 0) && (6 < lVar4)) {
      local_50 = (undefined1 *)(lVar3 + *in_RDI);
    }
    if (local_10 < local_50) {
      local_28 = local_28 + 2;
    }
    else {
      local_51 = 2;
      do {
        local_5a = *local_28;
        local_59 = '\b';
        do {
          lVar4 = ((long)local_10 - lVar3) % (long)*in_RDI;
          bVar1 = (byte)local_58;
          if (in_EDX == 0) {
            if (0x1d < lVar4) {
              local_28 = local_28 + (int)(uint)local_51;
              goto LAB_0010cf11;
            }
LAB_0010ce5e:
            if (lVar4 < 7) goto LAB_0010ce6a;
            local_58 = (int)(uint)local_5a >> 7;
            if (local_58 == 0) {
              *local_10 = 0x41;
            }
            else {
              *local_10 = 6;
            }
          }
          else {
            if (lVar4 < 0x16) goto LAB_0010ce5e;
LAB_0010ce6a:
            local_58 = (int)(uint)local_5a >> 7;
          }
          local_5a = local_5a << 1 | bVar1;
          local_10 = local_10 + 1;
          local_59 = local_59 + -1;
        } while (local_59 != '\0');
        local_28 = local_28 + 1;
        local_51 = local_51 - 1;
      } while (local_51 != 0);
    }
LAB_0010cf11:
    local_10 = puVar2 + *in_RDI;
    local_29 = local_29 + -1;
  } while (local_29 != '\0');
  (**(code **)(*(long *)(in_RDI + 6) + 0x10))(*(undefined8 *)(in_RDI + 6),&searchlight_plot::dirty);
  return;
}

Assistant:

void searchlight_plot(tgestate_t  *state,
                      attribute_t *attrs,
                      int          clip_left)
{
  /**
   * $AF3E: Searchlight circle shape.
   */
  static const uint8_t searchlight_shape[2 * 16] =
  {
    ________,________,
    ________,________,
    ________,________,
    _______X,X_______,
    _____XXX,XXX_____,
    ____XXXX,XXXX____,
    ____XXXX,XXXX____,
    ___XXXXX,XXXXX___,
    ___XXXXX,XXXXX___,
    ____XXXX,XXXX____,
    ____XXXX,XXXX____,
    _____XXX,XXX_____,
    _______X,X_______,
    ________,________,
    ________,________,
    ________,________
  };

  /* We can't ASSERT_SCREEN_ATTRIBUTES_PTR_VALID(attrs) here as expected as
   * the attrs pointer can be out of bounds... */

  attribute_t *const attrs_base = &state->speccy->screen.attributes[0];
  ASSERT_SCREEN_ATTRIBUTES_PTR_VALID(attrs_base);

{
  const uint8_t *shape;       /* was DE' */
  uint8_t        iters;       /* was C' */
  ptrdiff_t      x;           /* was A */
  attribute_t   *max_y_attrs; /* was HL */
  attribute_t   *saved_attrs; /* was stack */
  attribute_t   *min_y_attrs; /* was HL */
  uint8_t        iters2;      /* was B' */
  int            carry = 0;   /* added */

  /* Screen coords are x = 0..31, y = 0..23.
   * Game window occupies attribute rows 2..17 and columns 7..29 (inclusive).
   * Attribute row 18 is the row beyond the bottom edge of the game window.
   */

  // Conv: clip_left code was made a parameter, code handling it is hoisted.

  shape = &searchlight_shape[0];
  iters = 16; /* height */
  do
  {
    x = (attrs - attrs_base) % state->width; // Conv: was '& 31'. hoisted.

    // Finish if we're beyond the maximum y

    max_y_attrs = &attrs_base[18 * state->width]; // was HL = 0x5A40; // screen attribute address (column 0 + bottom of game screen)
    if (clip_left)
    {
      // BUG: This chunk seems to do nothing useful but allow the bottom
      // border to be overwritten. FUTURE: Remove.
      // Conv: was: if ((E & 31) >= 22) L = 32;
      if (x >= 22) // 22 => 8 attrs away from the edge maybe?
        max_y_attrs = &attrs_base[19 * state->width]; // row 19, column 0
    }
    if (attrs >= max_y_attrs) // gone off the end of the game screen?
      /* Conv: Original code just returned, instead goto exit so I can force
       * a screen refresh down there. */
      goto exit;

    saved_attrs = attrs; // PUSH DE

    // Clip/skip rows until we're in bounds

    min_y_attrs = &attrs_base[2 * state->width]; // screen attribute address (row 2, column 0)
    if (clip_left)
    {
      // BUG: Again, this chunk seems to do nothing useful but allow the
      // bottom border to be overwritten. FUTURE: Remove.
      // Conv: was: if (E & 31) >= 7) L = 32;
      if (x >= 7)
        min_y_attrs = &attrs_base[1 * state->width]; // row 1, column 0
    }
    if (attrs < min_y_attrs)
    {
      shape += 2;
      goto next_row;
    }

    iters2 = 2; /* iterations - rowbytes */
    do
    {
      uint8_t iters3; /* was B */
      uint8_t pixels; /* was C */

      pixels = *shape; // Conv: Original uses A as temporary.

      iters3 = 8; /* iterations - bits per byte */
      do
      {
        x = (attrs - attrs_base) % state->width;  // Conv: was '& 31'. was interleaved; '& 31's hoisted from below

        /* clip right hand edge */

        // i don't presently see any evidence that this chunk affects anything in the game, bcbw
        // does this stop us sliding into the next scanline of data?
        if (clip_left)
        {
          if (x >= 22)
            goto dont_plot; // this doesn't skip the whole remainder of the row unlike the case below
        }
        else
        {
          if (x >= 30) // Conv: Constant 30 was in E
          {
            shape += iters2; /* Conv: Was a loop. */
            goto next_row; // skip whole row
          }
        }

        /* clip left hand edge */

        if (x < 7) // Conv: Constant 7 was in D
        {
          /* Don't render leftwards of the game window */
dont_plot:
          RL(pixels); // no plot
        }
        else
        {
          // plot
          RL(pixels);
          if (carry)
            *attrs = attribute_YELLOW_OVER_BLACK;
          else
            *attrs = attribute_BRIGHT_BLUE_OVER_BLACK;
        }
        attrs++;
      }
      while (--iters3);

      shape++;
    }
    while (--iters2);

next_row:
    attrs = saved_attrs + state->width;
  }
  while (--iters);

exit:
  {
    /* FUTURE: Make the dirty rectangle more accurate. */
    static const zxbox_t dirty = { 7 * 8, 2 * 8, 29 * 8, 17 * 8 };
    state->speccy->draw(state->speccy, &dirty);
  }
}
}